

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_InvalidPublicDependencyIndex_Test::
~ValidationErrorTest_InvalidPublicDependencyIndex_Test
          (ValidationErrorTest_InvalidPublicDependencyIndex_Test *this)

{
  ValidationErrorTest_InvalidPublicDependencyIndex_Test *this_local;
  
  ~ValidationErrorTest_InvalidPublicDependencyIndex_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, InvalidPublicDependencyIndex) {
  BuildFile("name: \"foo.proto\"");
  BuildFileWithErrors(
      "name: \"bar.proto\" "
      "dependency: \"foo.proto\" "
      "public_dependency: 1",
      "bar.proto: bar.proto: OTHER: Invalid public dependency index.\n");
}